

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O3

bool google::protobuf::internal::GetAnyFieldDescriptors
               (Message *message,FieldDescriptor **type_url_field,FieldDescriptor **value_field)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *pFVar2;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  Descriptor *this;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  this = (Descriptor *)CONCAT44(extraout_var,iVar1);
  iVar1 = std::__cxx11::string::compare(*(char **)(this + 8));
  if (iVar1 == 0) {
    pFVar2 = Descriptor::FindFieldByNumber(this,1);
    *type_url_field = pFVar2;
    pFVar2 = Descriptor::FindFieldByNumber(this,2);
    *value_field = pFVar2;
    pFVar2 = *type_url_field;
    if (pFVar2 != (FieldDescriptor *)0x0) {
      if (*(once_flag **)(pFVar2 + 0x30) != (once_flag *)0x0) {
        local_20 = FieldDescriptor::TypeOnceInit;
        local_28 = pFVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar2 + 0x30),&local_20,&local_28);
      }
      if ((*(int *)(pFVar2 + 0x38) == 9) &&
         (pFVar2 = *value_field, pFVar2 != (FieldDescriptor *)0x0)) {
        if (*(once_flag **)(pFVar2 + 0x30) != (once_flag *)0x0) {
          local_20 = FieldDescriptor::TypeOnceInit;
          local_28 = pFVar2;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar2 + 0x30),&local_20,&local_28);
        }
        return *(int *)(pFVar2 + 0x38) == 0xc;
      }
    }
  }
  return false;
}

Assistant:

bool GetAnyFieldDescriptors(const Message& message,
                            const FieldDescriptor** type_url_field,
                            const FieldDescriptor** value_field) {
  const Descriptor* descriptor = message.GetDescriptor();
  if (descriptor->full_name() != kAnyFullTypeName) {
    return false;
  }
  *type_url_field = descriptor->FindFieldByNumber(1);
  *value_field = descriptor->FindFieldByNumber(2);
  return (*type_url_field != NULL &&
          (*type_url_field)->type() == FieldDescriptor::TYPE_STRING &&
          *value_field != NULL &&
          (*value_field)->type() == FieldDescriptor::TYPE_BYTES);
}